

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Miner.cpp
# Opt level: O2

void __thiscall xmrig::Miner::setJob(Miner *this,Job *job)

{
  pointer ppIVar1;
  bool bVar2;
  EVP_PKEY_CTX *extraout_RDX;
  EVP_PKEY_CTX *extraout_RDX_00;
  EVP_PKEY_CTX *src;
  EVP_PKEY_CTX *src_00;
  MinerPrivate *pMVar3;
  pointer ppIVar4;
  
  ppIVar1 = (this->d_ptr->backends).
            super__Vector_base<xmrig::IBackend_*,_std::allocator<xmrig::IBackend_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppIVar4 = (this->d_ptr->backends).
                 super__Vector_base<xmrig::IBackend_*,_std::allocator<xmrig::IBackend_*>_>._M_impl.
                 super__Vector_impl_data._M_start; ppIVar4 != ppIVar1; ppIVar4 = ppIVar4 + 1) {
    (*(*ppIVar4)->_vptr_IBackend[7])(*ppIVar4,job);
  }
  std::mutex::lock((mutex *)mutex);
  pMVar3 = this->d_ptr;
  bVar2 = true;
  src = extraout_RDX;
  if ((pMVar3->job).m_index == '\x01') {
    bVar2 = String::isEqual(&pMVar3->userJobId,&job->m_id);
    bVar2 = !bVar2;
    pMVar3 = this->d_ptr;
    src = extraout_RDX_00;
  }
  pMVar3->reset = bVar2;
  Job::copy(&pMVar3->job,(EVP_PKEY_CTX *)job,src);
  pMVar3 = this->d_ptr;
  (pMVar3->job).m_index = '\0';
  String::copy(&pMVar3->userJobId,(EVP_PKEY_CTX *)&job->m_id,src_00);
  pthread_mutex_unlock((pthread_mutex_t *)mutex);
  MinerPrivate::handleJobChange(this->d_ptr);
  return;
}

Assistant:

void xmrig::Miner::setJob(const Job &job)
{
    for (IBackend *backend : d_ptr->backends) {
        backend->prepare(job);
    }

    mutex.lock();

    const uint8_t index = 0;

    d_ptr->reset = !(d_ptr->job.index() == 1 && index == 0 && d_ptr->userJobId == job.id());
    d_ptr->job   = job;
    d_ptr->job.setIndex(index);

    if (index == 0) {
        d_ptr->userJobId = job.id();
    }

    mutex.unlock();
    d_ptr->handleJobChange();
}